

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.h
# Opt level: O0

bool __thiscall AnyType::OutputFromType<Boolean>(AnyType *this,ostream *os)

{
  bool bVar1;
  undefined1 local_30 [7];
  bool fConverted;
  Boolean t;
  ostream *os_local;
  AnyType *this_local;
  
  t._16_8_ = os;
  Boolean::Boolean((Boolean *)local_30,false);
  bVar1 = ConvertToType<Boolean>(this,(Boolean *)local_30);
  if (bVar1) {
    ::operator<<((ostream *)t._16_8_,(Boolean *)local_30);
  }
  return bVar1;
}

Assistant:

bool OutputFromType(std::ostream& os) const 
    {
        T t;
        bool fConverted = ConvertToType(t);
        if (fConverted)
            os << t;

        return fConverted;
    }